

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry_&>
 __thiscall
kj::
Table<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Entry,kj::HashIndex<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Callbacks>>
::find<0ul,capnp::(anonymous_namespace)::SchemaBindingsPair&>
          (Table<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Entry,kj::HashIndex<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Callbacks>>
           *this,SchemaBindingsPair *params)

{
  uint64_t *puVar1;
  RawSchema *pRVar2;
  RawSchema *pRVar3;
  Maybe<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry_&>
  MVar4;
  uint in_EAX;
  uint uVar5;
  undefined4 in_register_00000004;
  undefined4 extraout_var;
  int *in_RDX;
  uint64_t *puVar6;
  uint64_t *puVar7;
  Scope *pSVar8;
  int iVar9;
  uint64_t *puVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ArrayPtr<const_unsigned_char> s;
  uint local_38;
  uint local_34;
  
  if (params[3].scopeBindings != (Scope *)0x0) {
    pRVar2 = params->schema;
    local_34 = in_register_00000004;
    uVar5 = kj::_::HashCoder::operator*((HashCoder *)&kj::_::HASHCODER,*(RawSchema **)in_RDX);
    _local_38 = CONCAT44(local_34,uVar5);
    uVar5 = kj::_::HashCoder::operator*((HashCoder *)&kj::_::HASHCODER,*(Scope **)(in_RDX + 2));
    _local_38 = CONCAT44(uVar5,local_38);
    s.size_ = 8;
    s.ptr = (uchar *)&local_38;
    in_EAX = kj::_::HashCoder::operator*((HashCoder *)&kj::_::HASHCODER,s);
    pRVar3 = params[3].schema;
    puVar7 = (uint64_t *)(ulong)((int)params[3].scopeBindings - 1U & in_EAX);
    uVar5 = *(uint *)((long)&pRVar3->id + (long)puVar7 * 8 + 4);
    in_register_00000004 = extraout_var;
    if (uVar5 != 0) {
      puVar10 = &pRVar3->id + (long)puVar7;
      puVar6 = (uint64_t *)0x0;
      do {
        if ((uVar5 != 1) && ((uint)*puVar10 == in_EAX)) {
          puVar1 = &pRVar2->id + (ulong)(uVar5 - 2) * 3;
          auVar11._0_4_ = -(uint)((int)*puVar1 == *in_RDX);
          auVar11._4_4_ = -(uint)(*(int *)((long)puVar1 + 4) == in_RDX[1]);
          auVar11._8_4_ = -(uint)(*(int *)(puVar1 + 1) == in_RDX[2]);
          auVar11._12_4_ = -(uint)(*(int *)((long)puVar1 + 0xc) == in_RDX[3]);
          auVar12._4_4_ = auVar11._0_4_;
          auVar12._0_4_ = auVar11._4_4_;
          auVar12._8_4_ = auVar11._12_4_;
          auVar12._12_4_ = auVar11._8_4_;
          iVar9 = movmskpd((int)puVar10,auVar12 & auVar11);
          if (iVar9 == 3) {
            puVar6 = &params->schema->id + (ulong)(uVar5 - 2) * 3;
            break;
          }
        }
        pSVar8 = (Scope *)((long)puVar7 + 1);
        puVar7 = (uint64_t *)((ulong)pSVar8 & 0xffffffff);
        if (pSVar8 == params[3].scopeBindings) {
          puVar7 = puVar6;
        }
        puVar10 = &pRVar3->id + (long)puVar7;
        uVar5 = *(uint *)((long)puVar10 + 4);
      } while (uVar5 != 0);
      goto LAB_001a83ce;
    }
  }
  puVar6 = (uint64_t *)0x0;
LAB_001a83ce:
  *(uint64_t **)this = puVar6;
  MVar4.ptr._4_4_ = in_register_00000004;
  MVar4.ptr._0_4_ = in_EAX;
  return (Maybe<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry_&>
          )MVar4.ptr;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}